

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_INT *data)

{
  REF_NODE pRVar1;
  REF_MPI pRVar2;
  void *__ptr;
  uint uVar3;
  REF_INT *send_size;
  REF_INT *recv_size;
  long lVar4;
  REF_INT *pRVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  size_t sVar16;
  uint uVar17;
  REF_INT node1;
  REF_INT node0;
  int local_a8;
  uint local_a4;
  REF_NODE local_a0;
  REF_INT local_98;
  REF_INT local_94;
  void *local_90;
  ulong local_88;
  REF_MPI local_80;
  void *local_78;
  REF_INT *local_70;
  void *local_68;
  REF_INT *local_60;
  ulong local_58;
  ulong local_50;
  undefined4 *local_48;
  void *local_40;
  ulong local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar1 = ref_edge->node;
  sVar16 = (long)ref_mpi->n << 2;
  send_size = (REF_INT *)calloc(1,sVar16);
  if (send_size == (REF_INT *)0x0) {
    pcVar14 = "malloc a_size of REF_INT NULL";
    uVar9 = 0x16d;
    goto LAB_001abc35;
  }
  local_80 = ref_mpi;
  recv_size = (REF_INT *)calloc(1,sVar16);
  if (recv_size == (REF_INT *)0x0) {
    pcVar14 = "malloc b_size of REF_INT NULL";
    uVar9 = 0x16e;
    goto LAB_001abc35;
  }
  iVar8 = ref_edge->n;
  local_a0 = pRVar1;
  local_60 = data;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  else {
    uVar3 = local_80->id;
    iVar10 = 0;
    local_70 = recv_size;
    do {
      ref_edge_part(ref_edge,iVar10,(REF_INT *)&local_a4);
      if (local_a4 != uVar3) {
        send_size[(int)local_a4] = send_size[(int)local_a4] + 1;
      }
      iVar10 = iVar10 + 1;
      recv_size = local_70;
    } while (iVar8 != iVar10);
  }
  pRVar2 = local_80;
  local_a8 = iVar8;
  uVar3 = ref_mpi_alltoall(local_80,send_size,recv_size,1);
  if (uVar3 != 0) {
    pcVar14 = "alltoall sizes";
    uVar9 = 0x176;
LAB_001abc8a:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar9,
           "ref_edge_ghost_min_int",(ulong)uVar3,pcVar14);
    return uVar3;
  }
  uVar3 = pRVar2->n;
  lVar11 = (long)(int)uVar3;
  if (lVar11 < 1) {
    uVar17 = 0;
  }
  else {
    lVar4 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + send_size[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar11 != lVar4);
    if ((int)uVar17 < 0) {
      pcVar14 = "malloc a_nodes of REF_GLOB negative";
      uVar9 = 0x17a;
      goto LAB_001abce7;
    }
  }
  pRVar5 = (REF_INT *)malloc((ulong)(uVar17 * 2) << 3);
  if (pRVar5 == (REF_INT *)0x0) {
    pcVar14 = "malloc a_nodes of REF_GLOB NULL";
    uVar9 = 0x17a;
  }
  else {
    local_38 = (ulong)uVar17;
    sVar16 = local_38 * 4;
    local_70 = pRVar5;
    pvVar6 = malloc(sVar16);
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc a_data of REF_INT NULL";
      uVar9 = 0x17b;
      goto LAB_001abc35;
    }
    local_68 = pvVar6;
    pvVar6 = malloc(sVar16);
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc a_edge of REF_INT NULL";
      uVar9 = 0x17c;
      goto LAB_001abc35;
    }
    if ((int)uVar3 < 1) {
      uVar15 = 0;
    }
    else {
      lVar4 = 0;
      uVar15 = 0;
      do {
        uVar15 = uVar15 + recv_size[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar11 != lVar4);
      if ((int)uVar15 < 0) {
        pcVar14 = "malloc b_nodes of REF_GLOB negative";
        uVar9 = 0x180;
        goto LAB_001abce7;
      }
    }
    local_40 = pvVar6;
    pvVar6 = malloc((ulong)(uVar15 * 2) << 3);
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc b_nodes of REF_GLOB NULL";
      uVar9 = 0x180;
    }
    else {
      local_58 = (ulong)uVar15;
      local_90 = pvVar6;
      pvVar6 = malloc(local_58 * 4);
      if (pvVar6 == (void *)0x0) {
        pcVar14 = "malloc b_data of REF_INT NULL";
        uVar9 = 0x181;
      }
      else {
        if ((int)uVar3 < 0) {
          pcVar14 = "malloc a_next of REF_INT negative";
          uVar9 = 0x183;
LAB_001abce7:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 uVar9,"ref_edge_ghost_min_int",pcVar14);
          return 1;
        }
        local_78 = pvVar6;
        local_48 = (undefined4 *)malloc(lVar11 * 4);
        if (local_48 != (undefined4 *)0x0) {
          *local_48 = 0;
          local_a4 = 1;
          if (1 < uVar3) {
            lVar4 = 0;
            iVar8 = 0;
            do {
              iVar8 = iVar8 + send_size[lVar4];
              local_48[lVar4 + 1] = iVar8;
              lVar4 = lVar4 + 1;
              local_a4 = uVar3;
            } while (lVar11 + -1 != lVar4);
          }
          if ((long)ref_edge->n < 1) {
            uVar13 = 0;
          }
          else {
            local_50 = CONCAT44(local_50._4_4_,local_80->id);
            uVar12 = 0;
            local_88 = (long)ref_edge->n;
            do {
              ref_edge_part(ref_edge,(REF_INT)uVar12,(REF_INT *)&local_a4);
              if (local_a4 != (uint)local_50) {
                iVar8 = local_48[(int)local_a4];
                lVar7 = (long)iVar8;
                *(REF_INT *)((long)local_40 + lVar7 * 4) = (REF_INT)uVar12;
                *(REF_INT *)((long)local_68 + lVar7 * 4) = local_60[uVar12];
                pRVar5 = ref_edge->e2n;
                iVar10 = pRVar5[uVar12 * 2];
                lVar4 = -1;
                lVar11 = -1;
                if (((-1 < (long)iVar10) && (iVar10 < local_a0->max)) &&
                   (lVar11 = local_a0->global[iVar10], lVar11 < 0)) {
                  lVar11 = -1;
                }
                *(long *)(local_70 + lVar7 * 4) = lVar11;
                iVar10 = pRVar5[uVar12 * 2 + 1];
                if (((-1 < (long)iVar10) && (iVar10 < local_a0->max)) &&
                   (lVar4 = local_a0->global[iVar10], lVar4 < 0)) {
                  lVar4 = -1;
                }
                *(long *)(local_70 + (long)(int)(iVar8 * 2 | 1) * 2) = lVar4;
                local_48[(int)local_a4] = iVar8 + 1;
              }
              uVar12 = uVar12 + 1;
              uVar13 = local_88;
            } while (local_88 != uVar12);
          }
          local_a8 = (int)uVar13;
          uVar3 = ref_mpi_alltoallv(local_80,local_70,send_size,local_90,recv_size,2,2);
          if (uVar3 == 0) {
            uVar3 = ref_mpi_alltoallv(local_80,local_68,send_size,local_78,recv_size,1,1);
            if (uVar3 == 0) {
              if (uVar15 != 0) {
                local_50 = local_58 * 4;
                uVar13 = 0;
                do {
                  local_88 = uVar13;
                  uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_90 + uVar13 * 4),
                                         &local_94);
                  if (uVar3 != 0) {
                    pcVar14 = "loc 0";
                    uVar9 = 0x19e;
                    goto LAB_001abc8a;
                  }
                  uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_90 + local_88 * 4 + 8),
                                         &local_98);
                  if (uVar3 != 0) {
                    pcVar14 = "loc 1";
                    uVar9 = 0x19f;
                    goto LAB_001abc8a;
                  }
                  uVar3 = ref_edge_with(ref_edge,local_94,local_98,&local_a8);
                  if (uVar3 != 0) {
                    pcVar14 = "find edge";
                    uVar9 = 0x1a0;
                    goto LAB_001abc8a;
                  }
                  iVar8 = local_60[local_a8];
                  if (*(int *)((long)local_78 + local_88) < local_60[local_a8]) {
                    iVar8 = *(int *)((long)local_78 + local_88);
                  }
                  local_60[local_a8] = iVar8;
                  uVar13 = local_88 + 4;
                } while (local_50 != uVar13);
                if (uVar15 != 0) {
                  local_58 = local_58 << 2;
                  uVar13 = 0;
                  do {
                    uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_90 + uVar13 * 4),
                                           &local_94);
                    if (uVar3 != 0) {
                      pcVar14 = "loc 0";
                      uVar9 = 0x1a5;
                      goto LAB_001abc8a;
                    }
                    local_88 = uVar13;
                    uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_90 + uVar13 * 4 + 8),
                                           &local_98);
                    if (uVar3 != 0) {
                      pcVar14 = "loc 1";
                      uVar9 = 0x1a6;
                      goto LAB_001abc8a;
                    }
                    uVar3 = ref_edge_with(ref_edge,local_94,local_98,&local_a8);
                    if (uVar3 != 0) {
                      pcVar14 = "find edge";
                      uVar9 = 0x1a7;
                      goto LAB_001abc8a;
                    }
                    *(REF_INT *)((long)local_78 + local_88) = local_60[local_a8];
                    uVar13 = local_88 + 4;
                  } while (local_58 != uVar13);
                }
              }
              uVar3 = ref_mpi_alltoallv(local_80,local_78,recv_size,local_68,send_size,1,1);
              __ptr = local_40;
              pvVar6 = local_68;
              if (uVar3 == 0) {
                if (uVar17 != 0) {
                  uVar13 = 0;
                  do {
                    local_60[*(int *)((long)local_40 + uVar13 * 4)] =
                         *(REF_INT *)((long)local_68 + uVar13 * 4);
                    uVar13 = uVar13 + 1;
                  } while (local_38 != uVar13);
                }
                free(local_48);
                free(local_78);
                free(local_90);
                free(__ptr);
                free(pvVar6);
                free(local_70);
                free(recv_size);
                free(send_size);
                return 0;
              }
              pcVar14 = "alltoallv return data";
              uVar9 = 0x1ad;
            }
            else {
              pcVar14 = "alltoallv requested data";
              uVar9 = 0x19a;
            }
          }
          else {
            pcVar14 = "alltoallv requested nodes";
            uVar9 = 0x197;
          }
          goto LAB_001abc8a;
        }
        pcVar14 = "malloc a_next of REF_INT NULL";
        uVar9 = 0x183;
      }
    }
  }
LAB_001abc35:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar9,
         "ref_edge_ghost_min_int",pcVar14);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                          REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_INT *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_INT);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_data[a_next[part]] = data[edge];
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");
  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, b_data, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv requested data");

  /* min local data with remote ghost data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    data[edge] = MIN(b_data[request], data[edge]);
  }
  /* export local consistent data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_INT_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}